

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# plotsim.cc
# Opt level: O2

void timCallback(Timer *tim,Simulator *sim,int64_t *t,bool ismain)

{
  int iVar1;
  size_type sVar2;
  int64_t iVar3;
  long lVar4;
  undefined7 in_register_00000009;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *psVar5;
  _Elt_pointer plVar6;
  int *piVar7;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *psVar8;
  long lVar9;
  stack<long,_std::deque<long,_std::allocator<long>_>_> *this;
  bool bVar10;
  int64_t local_38;
  
  psVar8 = &vt2s;
  bVar10 = (int)CONCAT71(in_register_00000009,ismain) != 0;
  this = &vt2s;
  if (bVar10) {
    this = &vt1s;
  }
  piVar7 = &r2step;
  if (bVar10) {
    piVar7 = &r1step;
  }
  iVar1 = *piVar7;
  *piVar7 = iVar1 + -1;
  if (iVar1 < 2) {
    tim->isRunning = false;
    *t = 0;
    return;
  }
  sVar2 = std::deque<long,_std::allocator<long>_>::size(&this->c);
  psVar5 = &vt2s;
  if (ismain) {
    psVar5 = &vt1s;
  }
  plVar6 = (psVar5->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.super__Deque_impl_data
           ._M_finish._M_cur;
  if (sVar2 < (ulong)(long)*piVar7) {
    psVar5 = &vt2s;
    if (ismain) {
      psVar5 = &vt1s;
    }
    if (plVar6 != (psVar5->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
                  super__Deque_impl_data._M_start._M_cur) {
      psVar5 = &vt2s;
      if (ismain) {
        psVar5 = &vt1s;
      }
      if (plVar6 == (psVar5->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
                    super__Deque_impl_data._M_finish._M_first) {
        if (ismain) {
          psVar8 = &vt1s;
        }
        plVar6 = (psVar8->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
                 super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
      }
      lVar9 = (long)sim->MINT;
      if (plVar6[-1] <= (long)sim->MINT) goto LAB_00103964;
    }
    iVar3 = linearSpeedCurve(sim,*t);
    local_38 = (long)sim->MINT;
    if (sim->MINT < iVar3) {
      local_38 = iVar3;
    }
    std::deque<long,_std::allocator<long>_>::push_back(&this->c,&local_38);
    lVar9 = local_38;
  }
  else {
    psVar5 = &vt2s;
    if (ismain) {
      psVar5 = &vt1s;
    }
    if (plVar6 == (psVar5->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
                  super__Deque_impl_data._M_finish._M_first) {
      if (ismain) {
        psVar8 = &vt1s;
      }
      plVar6 = (psVar8->c).super__Deque_base<long,_std::allocator<long>_>._M_impl.
               super__Deque_impl_data._M_finish._M_node[-1] + 0x40;
    }
    lVar9 = plVar6[-1];
    std::deque<long,_std::allocator<long>_>::pop_back(&this->c);
  }
LAB_00103964:
  lVar4 = (long)((float)lVar9 * tg);
  if (ismain) {
    lVar4 = lVar9;
  }
  tim->period = (uint32_t)lVar4;
  *t = *t + lVar4;
  return;
}

Assistant:

static void timCallback(brown::Timer& tim, brown::Simulator& sim,
                        std::int64_t& t, bool ismain) {
    std::stack<std::int64_t>& vts = ismain ? vt1s : vt2s;
    int& rstep = ismain? r1step : r2step;

    if (--rstep <= 0) {
        tim.stop();
        t = 0; vts.empty();
        return;
    }

    // set next speed interval
    std::int64_t vt = 0;
    if (vts.size() >= rstep) { // decelerate
        vt = vts.top();
        vts.pop();
    } else if (vts.empty() || (vts.top() > sim.MINT)) { // accelerate
        vt = linearSpeedCurve(sim, t);
        if (vt < sim.MINT) { // speeding
            vt = sim.MINT;
        }
        vts.push(vt);
    } else { // hold
        vt = sim.MINT;
    }

    // adjust speed on secondary axis
    if (!ismain) {
        vt *= tg;
    }
    tim.setPeriod(vt);
    t += vt;
}